

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void shiftConstraints(QList<QSimplexConstraint_*> *constraints,qreal amount)

{
  long lVar1;
  QSimplexConstraint **ppQVar2;
  QSimplexConstraint *pQVar3;
  Span *pSVar4;
  ulong uVar5;
  long lVar6;
  Data *pDVar7;
  ulong uVar8;
  double dVar9;
  
  lVar1 = (constraints->d).size;
  if (lVar1 != 0) {
    ppQVar2 = (constraints->d).ptr;
    lVar6 = 0;
    do {
      pQVar3 = ppQVar2[lVar6];
      pDVar7 = (pQVar3->variables).d;
      if (pDVar7 == (Data *)0x0) {
LAB_005ceee0:
        pDVar7 = (Data *)0x0;
LAB_005ceee2:
        uVar8 = 0;
      }
      else {
        if (pDVar7->spans->offsets[0] != 0xff) goto LAB_005ceee2;
        uVar5 = 1;
        do {
          uVar8 = uVar5;
          if (pDVar7->numBuckets == uVar8) goto LAB_005ceee0;
          uVar5 = uVar8 + 1;
        } while (pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
      }
      dVar9 = 0.0;
      if (pDVar7 != (Data *)0x0 || uVar8 != 0) {
        do {
          pSVar4 = pDVar7->spans;
          dVar9 = dVar9 + *(double *)
                           (pSVar4[uVar8 >> 7].entries
                            [pSVar4[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f]].storage.data + 8);
          do {
            if (pDVar7->numBuckets - 1 == uVar8) {
              uVar8 = 0;
              pDVar7 = (Data *)0x0;
              break;
            }
            uVar8 = uVar8 + 1;
          } while (pSVar4[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
        } while ((uVar8 != 0) || (pDVar7 != (Data *)0x0));
      }
      pQVar3->constant = dVar9 * amount + pQVar3->constant;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar1);
  }
  return;
}

Assistant:

static void shiftConstraints(const QList<QSimplexConstraint *> &constraints, qreal amount)
{
    for (int i = 0; i < constraints.size(); ++i) {
        QSimplexConstraint *c = constraints.at(i);
        const qreal multiplier = std::accumulate(c->variables.cbegin(), c->variables.cend(), qreal(0));
        c->constant += multiplier * amount;
    }
}